

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryFill(TranslateToFuzzReader *this)

{
  Expression *value_00;
  Expression *dest_00;
  reference pvVar1;
  pointer pMVar2;
  Expression *size_00;
  Expression *size;
  Expression *local_30;
  Expression *value;
  Expression *dest;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  
  local_18 = this;
  if ((this->allowMemory & 1U) == 0) {
    Type::Type((Type *)&dest,none);
    this_local = (TranslateToFuzzReader *)makeTrivial(this,(Type)dest);
  }
  else {
    value = makePointer(this);
    Type::Type((Type *)&size,i32);
    local_30 = make(this,(Type)size);
    pvVar1 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(this->wasm + 0x78),0);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar1);
    size_00 = make(this,(Type)(pMVar2->addressType).id);
    dest_00 = value;
    value_00 = local_30;
    pvVar1 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(this->wasm + 0x78),0);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar1);
    this_local = (TranslateToFuzzReader *)
                 Builder::makeMemoryFill
                           (&this->builder,dest_00,value_00,size_00,
                            (Name)(pMVar2->super_Importable).super_Named.name.super_IString.str);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryFill() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Expression* dest = makePointer();
  Expression* value = make(Type::i32);
  Expression* size = make(wasm.memories[0]->addressType);
  return builder.makeMemoryFill(dest, value, size, wasm.memories[0]->name);
}